

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O2

void pm_linuxalsa_term(void)

{
  if (seq != (snd_seq_t *)0x0) {
    snd_seq_close();
    pm_free(descriptors);
    descriptors = (descriptor_type)0x0;
    pm_descriptor_index = 0;
    pm_descriptor_max = 0;
  }
  return;
}

Assistant:

void pm_linuxalsa_term(void)
{
    if (seq) {
        snd_seq_close(seq);
        pm_free(descriptors);
        descriptors = NULL;
        pm_descriptor_index = 0;
        pm_descriptor_max = 0;
    }
}